

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

Geometry * rw::Geometry::create(int32 numVerts,int32 numTris,uint32 flags)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  Geometry *this;
  Triangle *pTVar6;
  TexCoords *pTVar7;
  long lVar8;
  int iVar10;
  undefined1 auVar9 [16];
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar31;
  int iVar34;
  undefined1 auVar32 [16];
  int iVar35;
  undefined1 auVar33 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar38 [16];
  long lVar13;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 30"
  ;
  this = (Geometry *)(*Engine::memfuncs)((long)s_plglist,0x3000f);
  if (this == (Geometry *)0x0) {
    create();
    return (Geometry *)0x0;
  }
  numAllocated = numAllocated + 1;
  (this->object).type = '\b';
  (this->object).subType = '\0';
  (this->object).flags = '\0';
  (this->object).privateFlags = '\0';
  (this->object).parent = (void *)0x0;
  this->flags = flags & 0xff00ffff;
  uVar5 = flags >> 0x10 & 0xff;
  if (uVar5 == 0) {
    uVar5 = 1;
    if ((flags & 4) == 0) {
      uVar5 = flags >> 6 & 2;
    }
  }
  this->numTexCoordSets = uVar5;
  this->numTriangles = numTris;
  this->numVertices = numVerts;
  this->triangles = (Triangle *)0x0;
  this->colors = (RGBA *)0x0;
  this->texCoords[0] = (TexCoords *)0x0;
  this->texCoords[1] = (TexCoords *)0x0;
  this->texCoords[2] = (TexCoords *)0x0;
  this->texCoords[3] = (TexCoords *)0x0;
  this->texCoords[4] = (TexCoords *)0x0;
  this->texCoords[5] = (TexCoords *)0x0;
  this->texCoords[6] = (TexCoords *)0x0;
  this->texCoords[7] = (TexCoords *)0x0;
  if ((flags >> 0x18 & 1) != 0) goto LAB_0010b090;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 58"
  ;
  pTVar6 = (Triangle *)
           (*DAT_0014ada8)((long)(int)((numVerts * 4 & (int)(flags << 0x1c) >> 0x1f) +
                                      (uVar5 * numVerts + numTris) * 8),0x3000f);
  this->triangles = pTVar6;
  iVar1 = this->numTriangles;
  pTVar7 = (TexCoords *)(pTVar6 + iVar1);
  iVar31 = this->numVertices;
  if ((this->flags & 8) == 0) {
    if (iVar31 != 0) {
LAB_0010adaf:
      iVar10 = this->numTexCoordSets;
      if (0 < (long)iVar10) {
        lVar8 = 0;
        do {
          this->texCoords[lVar8] = pTVar7;
          pTVar7 = pTVar7 + iVar31;
          lVar8 = lVar8 + 1;
        } while (iVar10 != lVar8);
      }
    }
  }
  else if (iVar31 != 0) {
    this->colors = (RGBA *)pTVar7;
    pTVar7 = (TexCoords *)(&pTVar7->u + iVar31);
    goto LAB_0010adaf;
  }
  auVar4 = _DAT_001348e0;
  if (0 < iVar1) {
    lVar8 = (long)iVar1 + -1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar9 = auVar9 ^ _DAT_001348e0;
    auVar12 = _DAT_00134e60;
    auVar14 = _DAT_00134e70;
    auVar15 = _DAT_00134e80;
    auVar16 = _DAT_00134e90;
    do {
      auVar17 = auVar16 ^ auVar4;
      iVar31 = auVar9._0_4_;
      iVar30 = -(uint)(iVar31 < auVar17._0_4_);
      iVar10 = auVar9._4_4_;
      auVar18._4_4_ = -(uint)(iVar10 < auVar17._4_4_);
      iVar35 = auVar9._8_4_;
      iVar34 = -(uint)(iVar35 < auVar17._8_4_);
      iVar11 = auVar9._12_4_;
      auVar18._12_4_ = -(uint)(iVar11 < auVar17._12_4_);
      auVar27._4_4_ = iVar30;
      auVar27._0_4_ = iVar30;
      auVar27._8_4_ = iVar34;
      auVar27._12_4_ = iVar34;
      auVar36 = pshuflw(in_XMM11,auVar27,0xe8);
      auVar20._4_4_ = -(uint)(auVar17._4_4_ == iVar10);
      auVar20._12_4_ = -(uint)(auVar17._12_4_ == iVar11);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar38 = pshuflw(in_XMM12,auVar20,0xe8);
      auVar18._0_4_ = auVar18._4_4_;
      auVar18._8_4_ = auVar18._12_4_;
      auVar37 = pshuflw(auVar36,auVar18,0xe8);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar17 = (auVar37 | auVar38 & auVar36) ^ auVar17;
      auVar17 = packssdw(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6->v + lVar8 + 6) = 0xffff;
      }
      auVar18 = auVar20 & auVar27 | auVar18;
      auVar17 = packssdw(auVar18,auVar18);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
      if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)pTVar6[1].v + lVar8 + 6) = 0xffff;
      }
      auVar17 = auVar15 ^ auVar4;
      iVar30 = -(uint)(iVar31 < auVar17._0_4_);
      auVar32._4_4_ = -(uint)(iVar10 < auVar17._4_4_);
      iVar34 = -(uint)(iVar35 < auVar17._8_4_);
      auVar32._12_4_ = -(uint)(iVar11 < auVar17._12_4_);
      auVar19._4_4_ = iVar30;
      auVar19._0_4_ = iVar30;
      auVar19._8_4_ = iVar34;
      auVar19._12_4_ = iVar34;
      auVar26._4_4_ = -(uint)(auVar17._4_4_ == iVar10);
      auVar26._12_4_ = -(uint)(auVar17._12_4_ == iVar11);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar17 = auVar26 & auVar19 | auVar32;
      auVar17 = packssdw(auVar17,auVar17);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar2,auVar17 ^ auVar2);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[2].v + lVar8 + 6) = 0xffff;
      }
      auVar20 = pshufhw(auVar19,auVar19,0x84);
      auVar27 = pshufhw(auVar26,auVar26,0x84);
      auVar18 = pshufhw(auVar20,auVar32,0x84);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar18 | auVar27 & auVar20) ^ auVar21;
      auVar20 = packssdw(auVar21,auVar21);
      if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[3].v + lVar8 + 6) = 0xffff;
      }
      auVar20 = auVar14 ^ auVar4;
      iVar30 = -(uint)(iVar31 < auVar20._0_4_);
      auVar23._4_4_ = -(uint)(iVar10 < auVar20._4_4_);
      iVar34 = -(uint)(iVar35 < auVar20._8_4_);
      auVar23._12_4_ = -(uint)(iVar11 < auVar20._12_4_);
      auVar28._4_4_ = iVar30;
      auVar28._0_4_ = iVar30;
      auVar28._8_4_ = iVar34;
      auVar28._12_4_ = iVar34;
      auVar17 = pshuflw(auVar17,auVar28,0xe8);
      auVar22._4_4_ = -(uint)(auVar20._4_4_ == iVar10);
      auVar22._12_4_ = -(uint)(auVar20._12_4_ == iVar11);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      in_XMM12 = pshuflw(auVar38 & auVar36,auVar22,0xe8);
      in_XMM12 = in_XMM12 & auVar17;
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar17 = pshuflw(auVar17,auVar23,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar17 | in_XMM12) ^ auVar36;
      auVar17 = packssdw(auVar36,auVar36);
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[4].v + lVar8 + 6) = 0xffff;
      }
      auVar23 = auVar22 & auVar28 | auVar23;
      auVar17 = packssdw(auVar23,auVar23);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar38,auVar17 ^ auVar38);
      if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[5].v + lVar8 + 6) = 0xffff;
      }
      auVar17 = auVar12 ^ auVar4;
      iVar31 = -(uint)(iVar31 < auVar17._0_4_);
      auVar33._4_4_ = -(uint)(iVar10 < auVar17._4_4_);
      iVar35 = -(uint)(iVar35 < auVar17._8_4_);
      auVar33._12_4_ = -(uint)(iVar11 < auVar17._12_4_);
      auVar24._4_4_ = iVar31;
      auVar24._0_4_ = iVar31;
      auVar24._8_4_ = iVar35;
      auVar24._12_4_ = iVar35;
      auVar29._4_4_ = -(uint)(auVar17._4_4_ == iVar10);
      auVar29._12_4_ = -(uint)(auVar17._12_4_ == iVar11);
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar17 = auVar29 & auVar24 | auVar33;
      auVar17 = packssdw(auVar17,auVar17);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar17 ^ auVar3,auVar17 ^ auVar3);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[6].v + lVar8 + 6) = 0xffff;
      }
      auVar17 = pshufhw(auVar24,auVar24,0x84);
      auVar18 = pshufhw(auVar29,auVar29,0x84);
      auVar20 = pshufhw(auVar17,auVar33,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar20 | auVar18 & auVar17) ^ auVar25;
      auVar17 = packssdw(auVar25,auVar25);
      if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[7].v + lVar8 + 6) = 0xffff;
      }
      lVar13 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 8;
      auVar16._8_8_ = lVar13 + 8;
      lVar13 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar13 + 8;
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar13 + 8;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 8;
      auVar12._8_8_ = lVar13 + 8;
      lVar8 = lVar8 + 0x40;
    } while ((ulong)(iVar1 + 7U >> 3) << 6 != lVar8);
  }
LAB_0010b090:
  this->numMorphTargets = 0;
  this->morphTargets = (MorphTarget *)0x0;
  addMorphTargets(this,1);
  this->lockedSinceInst = 0;
  (this->matList).materials = (Material **)0x0;
  (this->matList).numMaterials = 0;
  (this->matList).space = 0;
  this->meshHeader = (MeshHeader *)0x0;
  this->instData = (InstanceDataHeader *)0x0;
  this->refCount = 1;
  PluginList::construct((PluginList *)&s_plglist,this);
  return this;
}

Assistant:

Geometry*
Geometry::create(int32 numVerts, int32 numTris, uint32 flags)
{
	Geometry *geo = (Geometry*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_GEOMETRY);
	if(geo == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	geo->object.init(Geometry::ID, 0);
	geo->flags = flags & 0xFF00FFFF;
	geo->numTexCoordSets = (flags & 0xFF0000) >> 16;
	if(geo->numTexCoordSets == 0)
		geo->numTexCoordSets = (geo->flags & TEXTURED)  ? 1 :
		                       (geo->flags & TEXTURED2) ? 2 : 0;
	geo->numTriangles = numTris;
	geo->numVertices = numVerts;

	geo->colors = nil;
	for(int32 i = 0; i < 8; i++)
		geo->texCoords[i] = nil;
	geo->triangles = nil;
	// Allocate all attributes at once. The triangle pointer
	// will hold the first address (even when there are no triangles)
	// so we can free easily.
	if(!(geo->flags & NATIVE)){
		int32 sz = geo->numTriangles*sizeof(Triangle);
		if(geo->flags & PRELIT)
			sz += geo->numVertices*sizeof(RGBA);
		sz += geo->numTexCoordSets*geo->numVertices*sizeof(TexCoords);

		uint8 *data = (uint8*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
		geo->triangles = (Triangle*)data;
		data += geo->numTriangles*sizeof(Triangle);
		if(geo->flags & PRELIT && geo->numVertices){
			geo->colors = (RGBA*)data;
			data += geo->numVertices*sizeof(RGBA);
		}
		if(geo->numVertices)
			for(int32 i = 0; i < geo->numTexCoordSets; i++){
				geo->texCoords[i] = (TexCoords*)data;
				data += geo->numVertices*sizeof(TexCoords);
			}

		// init triangles
		for(int32 i = 0; i < geo->numTriangles; i++)
			geo->triangles[i].matId = 0xFFFF;
	}
	geo->numMorphTargets = 0;
	geo->morphTargets = nil;
	geo->addMorphTargets(1);

	geo->matList.init();
	geo->lockedSinceInst = 0;
	geo->meshHeader = nil;
	geo->instData = nil;
	geo->refCount = 1;

	s_plglist.construct(geo);
	return geo;
}